

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

void __thiscall
BoardView::ShowSearchResults<std::shared_ptr<Component>>
          (BoardView *this,
          vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *results,
          char *search,int *limit,offset_in_BoardView_to_subr onSelect)

{
  pointer psVar1;
  char *label;
  bool bVar2;
  code *pcVar3;
  long in_R9;
  long *plVar4;
  shared_ptr<Component> *r;
  pointer psVar5;
  ImVec2 local_38;
  
  psVar5 = (results->
           super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (results->
           super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 != psVar1) {
    plVar4 = (long *)((long)&this->m_file + in_R9);
    do {
      label = (((psVar5->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->name).
              _M_dataplus._M_p;
      local_38.x = 0.0;
      local_38.y = 0.0;
      bVar2 = ImGui::Selectable(label,false,0,&local_38);
      if (bVar2) {
        pcVar3 = (code *)onSelect;
        if ((onSelect & 1) != 0) {
          pcVar3 = *(code **)(*plVar4 + -1 + onSelect);
        }
        (*pcVar3)(plVar4,label);
        snprintf(search,0x80,"%s",label);
        *limit = 0;
      }
      *limit = *limit + -1;
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar1);
  }
  return;
}

Assistant:

void BoardView::ShowSearchResults(std::vector<T> results, char *search, int &limit, void (BoardView::*onSelect)(const char *)) {
	for (auto &r : results) {
		const char *cname = getcname(r);
		if (ImGui::Selectable(cname, false)) {
			(this->*onSelect)(cname);
			snprintf(search, 128, "%s", cname);
			limit = 0;
		}
		limit--;
	}
}